

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

ProFunctionDef * __thiscall ProFunctionDef::operator=(ProFunctionDef *this,ProFunctionDef *other)

{
  int iVar1;
  ProFile *pPVar2;
  long in_FS_OFFSET;
  ProFunctionDef local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar2 = other->m_pro;
  iVar1 = other->m_offset;
  other->m_pro = (ProFile *)0x0;
  local_20.m_pro = this->m_pro;
  this->m_pro = pPVar2;
  local_20.m_offset = this->m_offset;
  this->m_offset = iVar1;
  local_20._12_4_ = 0xaaaaaaaa;
  ~ProFunctionDef(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ProFunctionDef &operator=(ProFunctionDef &&other) noexcept
    {
        ProFunctionDef moved(std::move(other));
        swap(moved);
        return *this;
    }